

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

ParseStatus __thiscall HTTPRequest::parse(HTTPRequest *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  undefined8 extraout_RAX;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  switch(this->status) {
  case WAITING_REQUEST_LINE:
    unaff_R14 = &local_70;
    ReadBuffer::get_line(&this->buffer);
    if ((char *)local_70._8_8_ == (char *)0x0) {
      return PARSE_FAILED;
    }
    parse_request_line(this,(char *)local_70._8_8_,local_70._M_allocated_capacity);
    this->status = WAITING_HEADER;
    break;
  case WAITING_HEADER:
    break;
  case WAITING_CONTENT:
    goto switchD_00106e1f_caseD_2;
  case GET_A_REQUEST:
    goto switchD_00106e1f_caseD_3;
  default:
    goto switchD_00106e1f_default;
  }
  if (this->status == WAITING_HEADER) {
    while( true ) {
      ReadBuffer::get_line(&this->buffer);
      if ((char *)local_70._8_8_ == (char *)0x0) {
        return PARSE_FAILED;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) break;
      iVar3 = parse_header_line(this,(char *)local_70._8_8_,local_70._M_allocated_capacity);
      if (iVar3 != 0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "ErrorParseHeader";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
    }
    unaff_R12 = &local_60;
    local_70._M_allocated_capacity = (size_type)unaff_R12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Content-Length","");
    unaff_R14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&this->header;
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)unaff_R14,(key_type *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity != unaff_R12) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
    if ((_Rb_tree_header *)iVar5._M_node == &(this->header)._M_t._M_impl.super__Rb_tree_header) {
      lVar9 = 0x98;
    }
    else {
      local_70._M_allocated_capacity = (size_type)unaff_R12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Content-Length","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)unaff_R14,(key_type *)&local_70);
      unaff_R14 = &local_50.field_2;
      pcVar1 = (pmVar6->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)unaff_R14;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pmVar6->_M_string_length);
      sVar7 = string_to_size_t(&local_50);
      this->content_length = sVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != unaff_R14) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity != unaff_R12) {
        operator_delete((void *)local_70._M_allocated_capacity);
      }
      if (this->content != (char *)0x0) {
        operator_delete(this->content);
        this->content = (char *)0x0;
      }
      uVar10 = 0xffffffffffffffff;
      if (-1 < this->content_length) {
        uVar10 = this->content_length;
      }
      pcVar8 = (char *)operator_new__(uVar10);
      this->content = pcVar8;
      lVar9 = 200;
    }
    *(undefined8 *)((long)&(this->method)._M_dataplus._M_p + lVar9) = 0;
    this->status = WAITING_CONTENT;
switchD_00106e1f_caseD_2:
    if (this->status == WAITING_CONTENT) {
      if ((this->content_length != 0) && (this->content_length != this->content_received)) {
        ReadBuffer::get_chars((ReadBuffer *)&local_70,(ssize_t)&this->buffer);
        uVar2 = local_70._M_allocated_capacity;
        if ((char *)local_70._8_8_ == (char *)0x0) {
          return PARSE_FAILED;
        }
        memcpy(this->content + this->content_received,(void *)local_70._8_8_,
               local_70._M_allocated_capacity);
        unaff_R14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(uVar2 + this->content_received);
        this->content_received = (ssize_t)unaff_R14;
        if (unaff_R14 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)this->content_length) {
          return PARSE_FAILED;
        }
      }
      this->status = GET_A_REQUEST;
switchD_00106e1f_caseD_3:
      if (this->status == GET_A_REQUEST) {
        return PARSE_NEW_REQUEST;
      }
      parse();
    }
    parse();
  }
  parse();
switchD_00106e1f_default:
  parse();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != unaff_R14) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != unaff_R12) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ParseStatus HTTPRequest::parse() {
    const char *str;
    ssize_t size;
    switch (this->status) {
        case WAITING_REQUEST_LINE:
            IF_FALSE_EXIT(this->status == WAITING_REQUEST_LINE);
            std::tie(str, size) = this->buffer.get_line();
            if (str == nullptr) return PARSE_FAILED;
            if (this->parse_request_line(str, size) != 0) throw "ErrorParseRequestLine";
            this->status = WAITING_HEADER;
        case WAITING_HEADER:
            IF_FALSE_EXIT(this->status == WAITING_HEADER);
            while (1) {
                std::tie(str, size) = this->buffer.get_line();
                if (str == nullptr) return PARSE_FAILED;
                if (size != 0) {
                    if (this->parse_header_line(str, size) != 0) throw "ErrorParseHeader";
                } else {
                    if (this->header.find("Content-Length") != this->header.end()) {
                        this->content_length = string_to_size_t(this->header["Content-Length"]);
                        if (this->content != nullptr) {
                            delete this->content;
                            this->content = nullptr;
                        }
                        this->content = new char[this->content_length];
                        this->content_received = 0;
                    } else {
                        this->content_length = 0;
                    }
                    this->status = WAITING_CONTENT;
                    break;
                }
            }
        case WAITING_CONTENT:
            IF_FALSE_EXIT(this->status == WAITING_CONTENT);
            if (this->content_length == 0 || this->content_length == this->content_received) {
                this->status = GET_A_REQUEST;
            } else {
                std::tie(str, size) = this->buffer.get_chars(this->content_length - this->content_received);
                if (str == nullptr) return PARSE_FAILED;
                memcpy(this->content + this->content_received, str, size * sizeof(char));
                this->content_received += size;
                if (this->content_received == this->content_length) {
                    this->status = GET_A_REQUEST;
                } else {
                    return PARSE_FAILED;
                }
            }
        case GET_A_REQUEST:
            IF_FALSE_EXIT(this->status == GET_A_REQUEST);
            return PARSE_NEW_REQUEST;
        default:
            IF_FALSE_EXIT(false);
    }
}